

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_178c6::InstrumentMemoryAccesses::doInitialization
          (InstrumentMemoryAccesses *this,Module *M)

{
  undefined8 uVar1;
  PointerType *pPVar2;
  IntegerType *pIVar3;
  raw_ostream *this_00;
  StringRef SVar4;
  StringRef SVar5;
  PointerType *local_40;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> params;
  
  uVar1 = llvm::Type::getVoidTy(*(LLVMContext **)M);
  pPVar2 = (PointerType *)llvm::Type::getInt8PtrTy(*(LLVMContext **)M,0);
  this->VoidPtrTy = pPVar2;
  pIVar3 = (IntegerType *)llvm::Type::getInt64Ty(*(LLVMContext **)M);
  this->SizeTy = pIVar3;
  params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = this->VoidPtrTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&params,(Type **)&local_40);
  local_40 = (PointerType *)this->SizeTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&params,(Type **)&local_40);
  local_40 = this->VoidPtrTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&params,(Type **)&local_40);
  local_40 = (PointerType *)this->SizeTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&params,(Type **)&local_40);
  llvm::FunctionType::get
            (uVar1,params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (long)params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,0);
  SVar4.Length = (size_t)"__loadcheck";
  SVar4.Data = (char *)M;
  llvm::Module::getOrInsertFunction(SVar4,(FunctionType *)0xb);
  SVar5.Length = (size_t)"__storecheck";
  SVar5.Data = (char *)M;
  llvm::Module::getOrInsertFunction(SVar5,(FunctionType *)0xc);
  this_00 = (raw_ostream *)llvm::errs();
  llvm::raw_ostream::operator<<(this_00,"[+] doInitialization done \n");
  std::_Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~_Vector_base
            (&params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>);
  return true;
}

Assistant:

bool InstrumentMemoryAccesses::doInitialization(Module &M) {
    Type *VoidTy = Type::getVoidTy(M.getContext());
    VoidPtrTy = Type::getInt8PtrTy(M.getContext());
    SizeTy = IntegerType::getInt64Ty(M.getContext());
    std::vector<Type*> params;
    params.push_back(VoidPtrTy);
    params.push_back(SizeTy);
    params.push_back(VoidPtrTy);
    params.push_back(SizeTy);
    FunctionType *LoadStoreFuncType = FunctionType::get(VoidTy,params,false);
    M.getOrInsertFunction("__loadcheck", LoadStoreFuncType);
    M.getOrInsertFunction("__storecheck", LoadStoreFuncType);
    errs() << "[+] doInitialization done \n";
    return true;
}